

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

Array * __thiscall
QPDFObjectHandle::as_array(Array *__return_storage_ptr__,QPDFObjectHandle *this,typed options)

{
  qpdf_object_type_e qVar1;
  shared_ptr<QPDFObject> local_30;
  typed local_19;
  QPDFObjectHandle *pQStack_18;
  typed options_local;
  QPDFObjectHandle *this_local;
  
  local_19 = options;
  pQStack_18 = this;
  this_local = (QPDFObjectHandle *)__return_storage_ptr__;
  if ((options & error) != strict) {
    assertType(this,"array",false);
  }
  if ((((local_19 & any_flag) == strict) &&
      (qVar1 = ::qpdf::BaseHandle::type_code(&this->super_BaseHandle), qVar1 != ot_array)) &&
     (((local_19 & optional) == strict ||
      (qVar1 = ::qpdf::BaseHandle::type_code(&this->super_BaseHandle), qVar1 != ot_null)))) {
    std::shared_ptr<QPDFObject>::shared_ptr(&local_30);
    ::qpdf::Array::Array(__return_storage_ptr__,&local_30);
    std::shared_ptr<QPDFObject>::~shared_ptr(&local_30);
    return __return_storage_ptr__;
  }
  ::qpdf::Array::Array(__return_storage_ptr__,(shared_ptr<QPDFObject> *)this);
  return __return_storage_ptr__;
}

Assistant:

inline qpdf::Array
QPDFObjectHandle::as_array(qpdf::typed options) const
{
    if (options & qpdf::error) {
        assertType("array", false);
    }
    if (options & qpdf::any_flag || type_code() == ::ot_array ||
        (options & qpdf::optional && type_code() == ::ot_null)) {
        return qpdf::Array(obj);
    }
    return qpdf::Array(std::shared_ptr<QPDFObject>());
}